

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContinuumElastic::ChContinuumElastic
          (ChContinuumElastic *this,double myoung,double mpoisson,double mdensity)

{
  undefined1 auVar1 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar4._8_56_ = in_register_00001248;
  auVar4._0_8_ = mpoisson;
  auVar2._8_56_ = in_register_00001208;
  auVar2._0_8_ = myoung;
  (this->super_ChContinuumMaterial).density = mdensity;
  auVar6._8_8_ = 0x4000000000000000;
  auVar6._0_8_ = 0x4000000000000000;
  (this->super_ChContinuumMaterial)._vptr_ChContinuumMaterial =
       (_func_int **)&PTR__ChContinuumElastic_00b26d38;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  this->E = myoung;
  this->v = mpoisson;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = myoung * mpoisson;
  auVar5 = vunpcklpd_avx(auVar2._0_16_,auVar5);
  auVar1 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar4._0_16_,ZEXT816(0xc000000000000000));
  auVar1 = vunpcklpd_avx(auVar6,auVar1);
  auVar3._0_8_ = (mpoisson + 1.0) * auVar1._0_8_;
  auVar3._8_8_ = (mpoisson + 1.0) * auVar1._8_8_;
  auVar5 = vdivpd_avx(auVar5,auVar3);
  this->G = (double)auVar5._0_8_;
  this->l = (double)auVar5._8_8_;
  ComputeStressStrainMatrix(this);
  ComputeStressStrainMatrix(this);
  this->damping_M = 0.0;
  this->damping_K = 0.0;
  return;
}

Assistant:

ChContinuumElastic::ChContinuumElastic(double myoung, double mpoisson, double mdensity)
    : ChContinuumMaterial(mdensity) {
    E = myoung;
    Set_v(mpoisson);              // sets also G and l
    ComputeStressStrainMatrix();  // sets Elasticity matrix
    this->damping_M = 0;
    this->damping_K = 0;
}